

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-val-req.cpp
# Opt level: O2

void __thiscall
yactfr::internal::JsonStrValMatchesRegexReq::JsonStrValMatchesRegexReq
          (JsonStrValMatchesRegexReq *this,regex *regex)

{
  JsonValReq::JsonValReq
            (&this->super_JsonValReq,(optional<yactfr::internal::JsonValKind>)0x500000001,false);
  (this->super_JsonValReq)._vptr_JsonValReq = (_func_int **)&PTR__JsonStrValMatchesRegexReq_00360f30
  ;
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&this->_regex,regex);
  return;
}

Assistant:

JsonStrValMatchesRegexReq::JsonStrValMatchesRegexReq(std::regex regex) :
    JsonValReq {JsonVal::Kind::Str},
    _regex {std::move(regex)}
{
}